

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::Clear(FileDescriptorProto *this)

{
  bool bVar1;
  UnknownFieldSet *this_00;
  FileDescriptorProto *this_local;
  
  if ((this->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(this);
    if ((bVar1) && (this->name_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
    bVar1 = has_package(this);
    if ((bVar1) && (this->package_ != (string *)internal::kEmptyString_abi_cxx11_)) {
      std::__cxx11::string::clear();
    }
  }
  if ((this->_has_bits_[0] & 0x1fe00) != 0) {
    bVar1 = has_options(this);
    if ((bVar1) && (this->options_ != (FileOptions *)0x0)) {
      FileOptions::Clear(this->options_);
    }
    bVar1 = has_source_code_info(this);
    if ((bVar1) && (this->source_code_info_ != (SourceCodeInfo *)0x0)) {
      SourceCodeInfo::Clear(this->source_code_info_);
    }
  }
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->dependency_);
  RepeatedField<int>::Clear(&this->public_dependency_);
  RepeatedField<int>::Clear(&this->weak_dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear(&this->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear(&this->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::Clear(&this->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear(&this->extension_);
  memset(this->_has_bits_,0,4);
  this_00 = mutable_unknown_fields(this);
  UnknownFieldSet::Clear(this_00);
  return;
}

Assistant:

void FileDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_package()) {
      if (package_ != &::google::protobuf::internal::kEmptyString) {
        package_->clear();
      }
    }
  }
  if (_has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::FileOptions::Clear();
    }
    if (has_source_code_info()) {
      if (source_code_info_ != NULL) source_code_info_->::google::protobuf::SourceCodeInfo::Clear();
    }
  }
  dependency_.Clear();
  public_dependency_.Clear();
  weak_dependency_.Clear();
  message_type_.Clear();
  enum_type_.Clear();
  service_.Clear();
  extension_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}